

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O3

void display_message(game_event_type unused,game_event_data *data,void *user)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  wchar_t wVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  wchar_t wVar10;
  int *h_00;
  char *pcVar11;
  char *buf_00;
  wchar_t w;
  wchar_t h;
  char buf [1024];
  wchar_t local_444;
  wchar_t local_440;
  int local_43c;
  char local_438 [1032];
  
  if (data != (game_event_data *)0x0) {
    wVar5 = (data->message).type;
    if (wVar5 == L'\x1a' && Term != (term *)0x0) {
      Term_xtra(L'\a',L'\0');
      return;
    }
    pcVar11 = data->string;
    if ((pcVar11 != (char *)0x0 && Term != (term *)0x0) && (character_generated)) {
      h_00 = &local_43c;
      Term_get_size(&local_444,h_00);
      wVar10 = message_column;
      if (msg_flag == false) {
        message_column = L'\0';
        sVar6 = strlen(pcVar11);
      }
      else {
        sVar6 = strlen(pcVar11);
        if ((wVar10 != L'\0') && (local_444 + L'\xfffffff8' < wVar10 + (int)sVar6)) {
          if (local_444 + L'\xfffffff8' < wVar10) {
            msg_flush_split_existing(local_444,h_00);
          }
          else {
            msg_flush(wVar10);
            message_column = L'\0';
          }
          msg_flag = false;
        }
      }
      wVar10 = (wchar_t)sVar6;
      if (wVar10 < L'ϩ') {
        buf_00 = local_438;
        my_strcpy(buf_00,pcVar11,0x400);
        bVar3 = message_type_color((uint16_t)wVar5);
        local_440 = (wchar_t)bVar3;
        if (local_444 <= message_column + wVar10) {
          pcVar11 = local_438;
          do {
            uVar4 = (local_444 - message_column) - 8;
            uVar7 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar7 = 0;
            }
            uVar4 = local_444 / 2 - message_column;
            uVar8 = uVar7;
            uVar9 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar9 = 0;
            }
            do {
              if ((long)uVar8 <= (long)uVar9) goto LAB_001d0fd5;
              uVar8 = uVar8 - 1;
            } while (pcVar11[uVar8 & 0xffffffff] != ' ');
            uVar7 = uVar8 & 0xffffffff;
LAB_001d0fd5:
            wVar5 = (wchar_t)uVar7;
            pcVar1 = pcVar11 + wVar5;
            buf_00 = pcVar1 + -1;
            cVar2 = *pcVar1;
            *pcVar1 = '\0';
            Term_putstr(message_column,L'\0',wVar5,local_440,pcVar11);
            msg_flush(wVar5 + message_column + L'\x01');
            *pcVar1 = cVar2;
            *buf_00 = ' ';
            wVar10 = (int)sVar6 - (wVar5 + L'\xffffffff');
            sVar6 = (size_t)(uint)wVar10;
            message_column = L'\0';
            pcVar11 = buf_00;
          } while (local_444 <= wVar10);
        }
        Term_putstr(message_column,L'\0',wVar10,local_440,buf_00);
        msg_flag = true;
        message_column = message_column + wVar10 + L'\x01';
      }
    }
  }
  return;
}

Assistant:

void display_message(game_event_type unused, game_event_data *data, void *user)
{
	int n;
	char *t;
	char buf[1024];
	uint8_t color;
	int w, h;

	int type;
	const char *msg;

	if (!data) return;

	type = data->message.type;
	msg = data->message.msg;

	if (Term && type == MSG_BELL) {
		Term_xtra(TERM_XTRA_NOISE, 0);
		return;
	}

	if (!msg || !Term || !character_generated)
		return;

	/* Obtain the size */
	(void)Term_get_size(&w, &h);

	/* Hack -- Reset */
	if (!msg_flag) message_column = 0;

	/* Message Length */
	n = (msg ? strlen(msg) : 0);

	/* Hack -- flush when requested or needed */
	if (message_column && (!msg || ((message_column + n) > (w - 8)))) {
		/* Flush */
		if (message_column <= w - 8) {
			msg_flush(message_column);
			message_column = 0;
		} else {
			msg_flush_split_existing(w, &message_column);
		}

		/* Forget it */
		msg_flag = false;
	}

	/* No message */
	if (!msg) return;

	/* Paranoia */
	if (n > 1000) return;

	/* Copy it */
	my_strcpy(buf, msg, sizeof(buf));

	/* Analyze the buffer */
	t = buf;

	/* Get the color of the message */
	color = message_type_color(type);

	/* Split message */
	while (message_column + n > w - 1) {
		/* Default split */
		int split = MAX(w - 8 - message_column, 0);
		int check = split;
		char oops;

		/* Find the rightmost split point */
		while (check > MAX(w / 2 - message_column, 0)) {
			--check;
			if (t[check] == ' ') {
				split = check;
				break;
			}
		}

		/* Save the split character */
		oops = t[split];

		/* Split the message */
		t[split] = '\0';

		/* Display part of the message */
		Term_putstr(message_column, 0, split, color, t);

		/* Flush it */
		msg_flush(message_column + split + 1);

		/* Restore the split character */
		t[split] = oops;

		/* Insert a space */
		t[--split] = ' ';

		/* Prepare to recurse on the rest of "buf" */
		t += split; n -= split; message_column = 0;
	}

	/* Display the tail of the message */
	Term_putstr(message_column, 0, n, color, t);

	/* Remember the message */
	msg_flag = true;

	/* Remember the position */
	message_column += n + 1;
}